

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubTransport_AMQP_Common_SendMessageDisposition
          (IOTHUB_DEVICE_HANDLE handle,IOTHUB_MESSAGE_HANDLE message_handle,
          IOTHUBMESSAGE_DISPOSITION_RESULT disposition)

{
  IOTHUB_MESSAGE_HANDLE pIVar1;
  IOTHUB_MESSAGE_RESULT IVar2;
  DEVICE_MESSAGE_DISPOSITION_RESULT disposition_result;
  int iVar3;
  LOGGER_LOG p_Var4;
  char *local_68;
  LOGGER_LOG l_2;
  char *device_id;
  DEVICE_MESSAGE_DISPOSITION_RESULT device_disposition_result;
  AMQP_TRANSPORT_DEVICE_INSTANCE *amqp_device_instance;
  LOGGER_LOG l_1;
  MESSAGE_DISPOSITION_CONTEXT_HANDLE device_message_disposition_info;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  IOTHUBMESSAGE_DISPOSITION_RESULT disposition_local;
  IOTHUB_MESSAGE_HANDLE message_handle_local;
  IOTHUB_DEVICE_HANDLE handle_local;
  
  l._4_4_ = disposition;
  _result = message_handle;
  message_handle_local = (IOTHUB_MESSAGE_HANDLE)handle;
  if ((message_handle == (IOTHUB_MESSAGE_HANDLE)0x0) || (handle == (IOTHUB_DEVICE_HANDLE)0x0)) {
    device_message_disposition_info =
         (MESSAGE_DISPOSITION_CONTEXT_HANDLE)xlogging_get_log_function();
    if (device_message_disposition_info != (MESSAGE_DISPOSITION_CONTEXT_HANDLE)0x0) {
      (*(code *)device_message_disposition_info)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                 ,"IoTHubTransport_AMQP_Common_SendMessageDisposition",0x8e5,1,
                 "Failed sending message disposition (handle=%p, message_handle=%p)",
                 message_handle_local,_result);
    }
    l._0_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    IVar2 = IoTHubMessage_GetDispositionContext
                      (message_handle,(MESSAGE_DISPOSITION_CONTEXT_HANDLE *)&l_1);
    pIVar1 = message_handle_local;
    if ((IVar2 == IOTHUB_MESSAGE_OK) && (l_1 != (LOGGER_LOG)0x0)) {
      disposition_result = get_device_disposition_result_from(l._4_4_);
      iVar3 = amqp_device_send_message_disposition
                        ((AMQP_DEVICE_HANDLE)(pIVar1->value).byteArray,
                         (DEVICE_MESSAGE_DISPOSITION_INFO *)l_1,disposition_result);
      if (iVar3 == 0) {
        l._0_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        local_68 = STRING_c_str(*(STRING_HANDLE *)pIVar1);
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          if (local_68 == (char *)0x0) {
            local_68 = "NULL";
          }
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_SendMessageDisposition",0x8fb,1,
                    "Device \'%s\' failed sending message disposition (amqp_device_send_message_disposition failed)"
                    ,local_68);
        }
        l._0_4_ = IOTHUB_CLIENT_ERROR;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                  ,"IoTHubTransport_AMQP_Common_SendMessageDisposition",0x8ef,1,
                  "Invalid message handle (no disposition context found)");
      }
      l._0_4_ = IOTHUB_CLIENT_INVALID_ARG;
    }
  }
  IoTHubMessage_Destroy(_result);
  return (IOTHUB_CLIENT_RESULT)l;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_AMQP_Common_SendMessageDisposition(IOTHUB_DEVICE_HANDLE handle, IOTHUB_MESSAGE_HANDLE message_handle, IOTHUBMESSAGE_DISPOSITION_RESULT disposition)
{
    IOTHUB_CLIENT_RESULT result;
    if (message_handle == NULL || handle == NULL)
    {
        LogError("Failed sending message disposition (handle=%p, message_handle=%p)", handle, message_handle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        MESSAGE_DISPOSITION_CONTEXT_HANDLE device_message_disposition_info;

        if (IoTHubMessage_GetDispositionContext(message_handle, &device_message_disposition_info) != IOTHUB_MESSAGE_OK ||
            device_message_disposition_info == NULL)
        {
            LogError("Invalid message handle (no disposition context found)");
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
        else
        {
            AMQP_TRANSPORT_DEVICE_INSTANCE* amqp_device_instance = (AMQP_TRANSPORT_DEVICE_INSTANCE*)handle;

            DEVICE_MESSAGE_DISPOSITION_RESULT device_disposition_result = get_device_disposition_result_from(disposition);

            if (amqp_device_send_message_disposition(amqp_device_instance->device_handle, (DEVICE_MESSAGE_DISPOSITION_INFO*)device_message_disposition_info, device_disposition_result) != RESULT_OK)
            {
                const char* device_id = STRING_c_str(amqp_device_instance->device_id); // advoid MU_P_OR_NULL double call
                LogError("Device '%s' failed sending message disposition (amqp_device_send_message_disposition failed)", MU_P_OR_NULL(device_id));
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
    }

    IoTHubMessage_Destroy(message_handle);

    return result;
}